

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborstreamreader.cpp
# Opt level: O3

void __thiscall QCborStreamReader::QCborStreamReader(QCborStreamReader *this,QIODevice *device)

{
  QCborStreamReader QVar1;
  byte bVar2;
  uint uVar3;
  uint8_t *puVar4;
  long lVar5;
  long lVar6;
  QCborStreamReaderPrivate *this_00;
  undefined8 *puVar7;
  ulong uVar8;
  
  this_00 = (QCborStreamReaderPrivate *)operator_new(0x78);
  QCborStreamReaderPrivate::QCborStreamReaderPrivate(this_00,device);
  *(QCborStreamReaderPrivate **)(this + 8) = this_00;
  *(undefined2 *)(this + 0x11) = 0;
  this[0x13] = (QCborStreamReader)0x0;
  if ((this_00->lastError).c == NoError) {
    QVar1 = (QCborStreamReader)(this_00->currentElement).type;
    this[0x10] = QVar1;
    if (QVar1 == (QCborStreamReader)0xff) {
      if ((this_00->device != (QIODevice *)0x0) &&
         ((this_00->containerStack).super_QList<CborValue>.d.size == 0)) {
        QByteArray::clear(&this_00->buffer);
        puVar7 = *(undefined8 **)(this + 8);
        if (puVar7[0xd] != 0) {
          QIODevice::skip((QIODevice *)*puVar7,puVar7[0xd]);
          puVar7 = *(undefined8 **)(this + 8);
        }
        puVar7[0xd] = 0;
      }
    }
    else {
      (this_00->lastError).c = NoError;
      if ((byte)((char)QVar1 + 0xbU) < 3) {
        this[0x10] = (QCborStreamReader)0xe0;
        *(ulong *)this = (ulong)(byte)(this_00->buffer).d.ptr[this_00->bufferStart] - 0xe0;
      }
      else {
        bVar2 = (this_00->currentElement).flags;
        if ((bVar2 & 2) == 0) {
          uVar8 = (ulong)(this_00->currentElement).extra;
        }
        else {
          puVar4 = (this_00->currentElement).source.ptr;
          lVar5 = *(long *)(puVar4 + 0x10);
          lVar6 = *(long *)(puVar4 + 0x68);
          if ((bVar2 & 1) == 0) {
            uVar3 = *(uint *)(lVar5 + 1 + lVar6);
            uVar8 = (ulong)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                           uVar3 << 0x18);
          }
          else {
            uVar8 = *(ulong *)(lVar5 + 1 + lVar6);
            uVar8 = uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 |
                    (uVar8 & 0xff0000000000) >> 0x18 | (uVar8 & 0xff00000000) >> 8 |
                    (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
                    (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38;
          }
        }
        *(ulong *)this = uVar8;
        if ((bVar2 & 4) != 0 && QVar1 == (QCborStreamReader)0x0) {
          this[0x10] = (QCborStreamReader)0x20;
        }
      }
    }
  }
  else {
    this[0x10] = (QCborStreamReader)0xff;
  }
  return;
}

Assistant:

QCborStreamReader::QCborStreamReader(QIODevice *device)
    : d(new QCborStreamReaderPrivate(device))
{
    preparse();
}